

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_random.cpp
# Opt level: O2

Reals __thiscall
Omega_h::unit_uniform_random_reals_from_globals(Omega_h *this,GOs *globals,I64 seed,I64 counter)

{
  Alloc *pAVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  void *extraout_RDX;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint size_in;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Reals RVar21;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_141;
  string local_140;
  Write<double> local_120;
  Write<double> out;
  Write<double> local_d0;
  type functor;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pAVar1 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar15 = pAVar1->size;
  }
  else {
    sVar15 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_140,"",(allocator *)&functor);
  size_in = (uint)(sVar15 >> 3);
  Write<double>::Write(&out,size_in,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  Write<long>::Write((Write<int> *)&functor,(Write<int> *)globals);
  functor.seed = seed;
  functor.counter = counter;
  Write<double>::Write(&functor.out,&out);
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_141);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x54);
  std::operator+(&local_140,&local_50,&local_90);
  begin_code("parallel_for",local_140._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<long>::Write((Write<int> *)&local_140,(Write<int> *)&functor);
    local_140.field_2._M_allocated_capacity = functor.seed;
    local_140.field_2._8_8_ = functor.counter;
    Write<double>::Write(&local_120,&functor.out);
    entering_parallel = 0;
    uVar12 = ((ulong)local_140.field_2._8_8_ >> 1 & 0xffffffff) * 0xd2511f53;
    uVar14 = (local_140.field_2._M_allocated_capacity & 0xffffffff) * 0xcd9e8d57;
    uVar4 = uVar14 >> 0x20;
    for (uVar9 = 0; (size_in & 0x7fffffff) != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = *(ulong *)(local_140._M_string_length + uVar9 * 8);
      dVar18 = 0.0;
      uVar13 = (uint)uVar14;
      iVar3 = (int)uVar2;
      uVar7 = local_140.field_2._8_8_;
      if ((local_140.field_2._8_8_ & 1) != 0) {
        uVar5 = (uVar2 & 0xffffffff ^ (ulong)local_140.field_2._8_8_ >> 0x21 ^ uVar4) * 0xd2511f53;
        lVar16 = ((uVar12 ^ local_140.field_2._M_allocated_capacity ^ uVar2) >> 0x20) * 0xcd9e8d57;
        lVar8 = ((uVar2 + 0xbb67ae8500000000 ^ uVar5) >> 0x20 ^ uVar12 & 0xffffffff) * 0xcd9e8d57;
        uVar10 = (ulong)(uVar13 ^ iVar3 + 0x9e3779b9U ^ (uint)((ulong)lVar16 >> 0x20)) * 0xd2511f53;
        lVar6 = (uVar5 & 0xffffffff ^ (uVar2 + 0x76cf5d0a00000000 ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = (ulong)((uint)lVar16 ^ iVar3 + 0x3c6ef372U ^ (uint)((ulong)lVar8 >> 0x20)) *
                0xd2511f53;
        lVar11 = (uVar10 & 0xffffffff ^ (uVar2 + 0x32370b8f00000000 ^ uVar5) >> 0x20) * 0xcd9e8d57;
        uVar10 = (ulong)((uint)lVar8 ^ iVar3 + 0xdaa66d2bU ^ (uint)((ulong)lVar6 >> 0x20)) *
                 0xd2511f53;
        lVar8 = (uVar5 & 0xffffffff ^ (uVar2 + 0xed9eba1400000000 ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = (ulong)((uint)lVar6 ^ iVar3 + 0x78dde6e4U ^ (uint)((ulong)lVar11 >> 0x20)) *
                0xd2511f53;
        lVar16 = (uVar10 & 0xffffffff ^ (uVar2 + 0xa906689900000000 ^ uVar5) >> 0x20) * 0xcd9e8d57;
        uVar10 = (ulong)((uint)lVar11 ^ iVar3 + 0x1715609dU ^ (uint)((ulong)lVar8 >> 0x20)) *
                 0xd2511f53;
        lVar6 = (uVar5 & 0xffffffff ^ (uVar2 + 0x646e171e00000000 ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = (ulong)((uint)lVar6 ^ iVar3 + 0xf1bbcdc8U ^
                       (uint)((uVar10 & 0xffffffff ^
                              ((ulong)((uint)lVar8 ^ iVar3 + 0xb54cda56U ^
                                      (uint)((ulong)lVar16 >> 0x20)) * 0xd2511f53 ^
                              uVar2 + 0x1fd5c5a300000000) >> 0x20) * 0xcd9e8d57 >> 0x20));
        lVar8 = uVar5 * -0x2daee0ad00000000;
        auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar19._0_8_ = lVar8;
        auVar19._12_4_ = 0x45300000;
        dVar18 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   (uint)(uVar5 * 0xd2511f53 >> 0x20) ^
                                   (uint)(uVar2 + 0x96a522ad00000000 >> 0x20) ^
                                   ((uint)lVar16 ^ iVar3 + 0x5384540fU ^
                                   (uint)((ulong)lVar6 >> 0x20)) * -0x2daee0ad) - 4503599627370496.0
                 )) * 5.421010862427522e-20;
        uVar7 = local_140.field_2._8_8_ & 0xfffffffffffffffe;
      }
      if ((uVar7 & 1) == 0) {
        uVar10 = ((ulong)uVar7 >> 1 & 0xffffffff) * 0xd2511f53;
        lVar8 = ((uVar2 ^ local_140.field_2._M_allocated_capacity ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = ((ulong)uVar7 >> 0x21 ^ uVar4 ^ uVar2 & 0xffffffff) * 0xd2511f53;
        lVar16 = (uVar10 & 0xffffffff ^ (uVar2 + 0xbb67ae8500000000 ^ uVar5) >> 0x20) * 0xcd9e8d57;
        uVar10 = (ulong)(uVar13 ^ iVar3 + 0x9e3779b9U ^ (uint)((ulong)lVar8 >> 0x20)) * 0xd2511f53;
        lVar6 = (uVar5 & 0xffffffff ^ (uVar2 + 0x76cf5d0a00000000 ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = (ulong)((uint)lVar8 ^ iVar3 + 0x3c6ef372U ^ (uint)((ulong)lVar16 >> 0x20)) *
                0xd2511f53;
        lVar11 = (uVar10 & 0xffffffff ^ (uVar2 + 0x32370b8f00000000 ^ uVar5) >> 0x20) * 0xcd9e8d57;
        uVar10 = (ulong)((uint)lVar16 ^ iVar3 + 0xdaa66d2bU ^ (uint)((ulong)lVar6 >> 0x20)) *
                 0xd2511f53;
        lVar8 = (uVar5 & 0xffffffff ^ (uVar2 + 0xed9eba1400000000 ^ uVar10) >> 0x20) * 0xcd9e8d57;
        uVar5 = (ulong)((uint)lVar6 ^ iVar3 + 0x78dde6e4U ^ (uint)((ulong)lVar11 >> 0x20)) *
                0xd2511f53;
        lVar6 = (uVar10 & 0xffffffff ^ (uVar2 + 0xa906689900000000 ^ uVar5) >> 0x20) * 0xcd9e8d57;
        uVar17 = (ulong)((uint)lVar11 ^ iVar3 + 0x1715609dU ^ (uint)((ulong)lVar8 >> 0x20)) *
                 0xd2511f53;
        uVar10 = (ulong)((uint)lVar8 ^ iVar3 + 0xb54cda56U ^ (uint)((ulong)lVar6 >> 0x20)) *
                 0xd2511f53;
        uVar5 = uVar10 & 0xffffffff ^
                ((ulong)((uint)lVar6 ^ iVar3 + 0x5384540fU ^
                        (uint)((uVar5 & 0xffffffff ^ (uVar2 + 0x646e171e00000000 ^ uVar17) >> 0x20)
                               * 0xcd9e8d57 >> 0x20)) * 0xd2511f53 ^ uVar2 + 0xdb3d742800000000) >>
                0x20;
        lVar6 = uVar5 * -0x326172a900000000;
        auVar20._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar20._0_8_ = lVar6;
        auVar20._12_4_ = 0x45300000;
        dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   iVar3 + 0x8ff34781U ^
                                   ((uint)(uVar2 + 0x1fd5c5a300000000 >> 0x20) ^
                                    (uint)(uVar10 >> 0x20) ^ (uint)uVar17) * -0x326172a9 ^
                                   (uint)(uVar5 * 0xcd9e8d57 >> 0x20)) - 4503599627370496.0)) *
                 5.421010862427522e-20;
      }
      *(double *)((long)local_120.shared_alloc_.direct_ptr + uVar9 * 8) = dVar18;
    }
    unit_uniform_random_reals_from_globals(Omega_h::Read<long>,long,long)::$_0::~__0
              ((__0 *)&local_140);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  Write<double>::Write(&local_d0,&out);
  Read<double>::Read((Read<signed_char> *)this,&local_d0);
  Write<double>::~Write(&local_d0);
  unit_uniform_random_reals_from_globals(Omega_h::Read<long>,long,long)::$_0::~__0((__0 *)&functor);
  Write<double>::~Write(&out);
  RVar21.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar21.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar21.write_.shared_alloc_;
}

Assistant:

Reals unit_uniform_random_reals_from_globals(
    GOs const globals, I64 const seed, I64 const counter) {
  auto const n = globals.size();
  auto const out = Write<Real>(n);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    auto const global = globals[i];
    UnitUniformDistribution distrib(seed, global, counter);
    out[i] = distrib();
  };
  parallel_for(n, std::move(functor));
  return out;
}